

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O1

bool __thiscall cmListFileParser::Parse(cmListFileParser *this)

{
  cmMessenger *this_00;
  ios_base iVar1;
  bool bVar2;
  cmListFileLexer_Token *pcVar3;
  char *pcVar4;
  size_t sVar5;
  byte bVar6;
  bool bVar7;
  char cVar8;
  ostringstream error;
  string local_268;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *local_248;
  long *local_240;
  long *local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_230;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_228;
  cmListFileContext local_218;
  _Storage<cmListFileContext,_false> local_1a8;
  ios_base local_138 [264];
  
  local_230 = &this->FunctionName;
  local_238 = &this->FunctionLine;
  local_240 = &this->FunctionLineEnd;
  local_248 = &this->FunctionArguments;
  bVar7 = true;
  do {
    pcVar3 = cmListFileLexer_Scan(this->Lexer);
    if (pcVar3 == (cmListFileLexer_Token *)0x0) {
      cVar8 = '\x03';
    }
    else {
      cVar8 = '\0';
      switch(pcVar3->type) {
      case cmListFileLexer_Token_Space:
        break;
      case cmListFileLexer_Token_Newline:
        bVar7 = true;
        cVar8 = '\0';
        break;
      case cmListFileLexer_Token_Identifier:
        if (!bVar7) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8._M_value);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8._M_value,"Parse error.  Expected a newline, got ",0x26);
          pcVar4 = cmListFileLexer_GetTypeAsString(this->Lexer,pcVar3->type);
          if (pcVar4 == (char *)0x0) {
            std::ios::clear((int)&local_268 +
                            (int)*(undefined8 *)
                                  ((long)local_1a8._M_value.Name._M_dataplus._M_p + -0x18) + 0xc0);
          }
          else {
            sVar5 = strlen(pcVar4);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8._M_value,pcVar4,sVar5);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8._M_value," with text \"",0xc);
          pcVar4 = pcVar3->text;
          if (pcVar4 == (char *)0x0) {
            std::ios::clear((int)&local_268 +
                            (int)*(undefined8 *)
                                  ((long)local_1a8._M_value.Name._M_dataplus._M_p + -0x18) + 0xc0);
          }
          else {
            sVar5 = strlen(pcVar4);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8._M_value,pcVar4,sVar5);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8._M_value,"\".",2)
          ;
          std::__cxx11::stringbuf::str();
          IssueError(this,&local_268);
          goto LAB_00259223;
        }
        bVar2 = ParseFunction(this,pcVar3->text,(long)pcVar3->line);
        if (bVar2) {
          std::vector<cmListFileFunction,std::allocator<cmListFileFunction>>::
          emplace_back<std::__cxx11::string,long&,long&,std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>>
                    ((vector<cmListFileFunction,std::allocator<cmListFileFunction>> *)this->ListFile
                     ,local_230,local_238,local_240,local_248);
        }
        bVar7 = false;
        cVar8 = !bVar2;
        break;
      default:
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8._M_value);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8._M_value,"Parse error.  Expected a command name, got ",0x2b
                  );
        pcVar4 = cmListFileLexer_GetTypeAsString(this->Lexer,pcVar3->type);
        if (pcVar4 == (char *)0x0) {
          std::ios::clear((int)&local_268 +
                          (int)*(undefined8 *)
                                ((long)local_1a8._M_value.Name._M_dataplus._M_p + -0x18) + 0xc0);
        }
        else {
          sVar5 = strlen(pcVar4);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8._M_value,pcVar4,sVar5);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8._M_value," with text \"",0xc);
        pcVar4 = pcVar3->text;
        if (pcVar4 == (char *)0x0) {
          std::ios::clear((int)&local_268 +
                          (int)*(undefined8 *)
                                ((long)local_1a8._M_value.Name._M_dataplus._M_p + -0x18) + 0xc0);
        }
        else {
          sVar5 = strlen(pcVar4);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8._M_value,pcVar4,sVar5);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8._M_value,"\".",2);
        std::__cxx11::stringbuf::str();
        IssueError(this,&local_268);
LAB_00259223:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != &local_268.field_2) {
          operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8._M_value);
        std::ios_base::~ios_base(local_138);
        cVar8 = '\x01';
        break;
      case cmListFileLexer_Token_CommentBracket:
        bVar7 = false;
        cVar8 = '\0';
      }
    }
    if (cVar8 != '\0') {
      if (cVar8 == '\x03') {
        CheckNesting((optional<cmListFileContext> *)&local_1a8._M_value,this);
        iVar1 = local_138[0];
        if (local_138[0] == (ios_base)0x1) {
          this_00 = this->Messenger;
          local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_268,"Flow control statements are not properly nested.","");
          cmListFileContext::cmListFileContext(&local_218,&local_1a8._M_value);
          cmConstStack<cmListFileContext,_cmListFileBacktrace>::Push
                    (&local_228,(cmListFileContext *)&this->Backtrace);
          cmMessenger::IssueMessage
                    (this_00,FATAL_ERROR,&local_268,(cmListFileBacktrace *)&local_228);
          if (local_228.TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_228.TopEntry.
                       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if ((local_218.DeferId.
               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ._M_engaged == true) &&
             (local_218.DeferId.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_engaged = false,
             local_218.DeferId.
             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ._M_payload._M_value._M_dataplus._M_p !=
             ((pointer)
             ((long)&local_218.DeferId.
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     ._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             + 0x10U))._M_p)) {
            operator_delete((void *)local_218.DeferId.
                                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                    ._M_payload.
                                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                    .
                                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ._M_payload._M_value._M_dataplus._M_p,
                            local_218.DeferId.
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_payload._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218.FilePath._M_dataplus._M_p != &local_218.FilePath.field_2) {
            operator_delete(local_218.FilePath._M_dataplus._M_p,
                            local_218.FilePath.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218.Name._M_dataplus._M_p != &local_218.Name.field_2) {
            operator_delete(local_218.Name._M_dataplus._M_p,
                            local_218.Name.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_dataplus._M_p != &local_268.field_2) {
            operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
          }
          cmSystemTools::s_FatalErrorOccurred = true;
        }
        if (local_138[0] == (ios_base)0x1) {
          std::_Optional_payload_base<cmListFileContext>::_M_destroy
                    ((_Optional_payload_base<cmListFileContext> *)&local_1a8._M_value);
        }
        bVar6 = (byte)iVar1 ^ 1;
      }
      else {
        bVar6 = 0;
      }
      return (bool)bVar6;
    }
  } while( true );
}

Assistant:

bool cmListFileParser::Parse()
{
  // Use a simple recursive-descent parser to process the token
  // stream.
  bool haveNewline = true;
  while (cmListFileLexer_Token* token = cmListFileLexer_Scan(this->Lexer)) {
    if (token->type == cmListFileLexer_Token_Space) {
    } else if (token->type == cmListFileLexer_Token_Newline) {
      haveNewline = true;
    } else if (token->type == cmListFileLexer_Token_CommentBracket) {
      haveNewline = false;
    } else if (token->type == cmListFileLexer_Token_Identifier) {
      if (haveNewline) {
        haveNewline = false;
        if (this->ParseFunction(token->text, token->line)) {
          this->ListFile->Functions.emplace_back(
            std::move(this->FunctionName), this->FunctionLine,
            this->FunctionLineEnd, std::move(this->FunctionArguments));
        } else {
          return false;
        }
      } else {
        std::ostringstream error;
        error << "Parse error.  Expected a newline, got "
              << cmListFileLexer_GetTypeAsString(this->Lexer, token->type)
              << " with text \"" << token->text << "\".";
        this->IssueError(error.str());
        return false;
      }
    } else {
      std::ostringstream error;
      error << "Parse error.  Expected a command name, got "
            << cmListFileLexer_GetTypeAsString(this->Lexer, token->type)
            << " with text \"" << token->text << "\".";
      this->IssueError(error.str());
      return false;
    }
  }

  // Check if all functions are nested properly.
  if (auto badNesting = this->CheckNesting()) {
    this->Messenger->IssueMessage(
      MessageType::FATAL_ERROR,
      "Flow control statements are not properly nested.",
      this->Backtrace.Push(*badNesting));
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  return true;
}